

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O3

void __thiscall Prog::draw_bitmap(Prog *this,string *str,string *how,bool memory,bool destination)

{
  ALLEGRO_BITMAP *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ALLEGRO_BITMAP **ppAVar7;
  ALLEGRO_BITMAP **ppAVar8;
  undefined3 in_register_00000081;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 uVar16;
  float fVar17;
  long *local_50 [2];
  long local_40 [2];
  
  uVar9 = CONCAT31(in_register_00000081,destination) << 6;
  iVar2 = HSlider::get_cur_value((HSlider *)(&this->field_0x860 + uVar9));
  iVar3 = HSlider::get_cur_value((HSlider *)(&this->field_0x920 + uVar9));
  iVar4 = HSlider::get_cur_value((HSlider *)(&this->field_0x9e0 + uVar9));
  iVar5 = HSlider::get_cur_value((HSlider *)(&this->field_0xaa0 + uVar9));
  fVar15 = (float)iVar5 / 255.0;
  fVar12 = ((float)iVar3 / 255.0) * fVar15;
  uVar10 = al_map_rgba_f(((float)iVar2 / 255.0) * fVar15,fVar12,((float)iVar4 / 255.0) * fVar15);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Mysha","");
  lVar6 = std::__cxx11::string::find((char *)str,(ulong)local_50[0],0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ppAVar7 = &mysha_bmp;
  if (lVar6 == -1) {
    ppAVar7 = &allegro_bmp;
  }
  ppAVar8 = &mysha;
  if (lVar6 == -1) {
    ppAVar8 = &allegro;
  }
  if (memory) {
    ppAVar8 = ppAVar7;
  }
  pAVar1 = *ppAVar8;
  iVar2 = std::__cxx11::string::compare((char *)how);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)str);
    if (iVar2 != 0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tint","");
      lVar6 = std::__cxx11::string::find((char *)str,(ulong)local_50[0],0);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (lVar6 != -1) {
        al_draw_tinted_bitmap(uVar10,fVar12,0,0,pAVar1,0);
        return;
      }
      al_draw_bitmap(0,0,pAVar1,0);
      return;
    }
    uVar14 = 0x43a00000;
    uVar16 = 0x43480000;
    uVar11 = 0;
    uVar13 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)how);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)how);
      if (iVar2 != 0) {
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)str);
      if (iVar2 != 0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tint","");
        lVar6 = std::__cxx11::string::find((char *)str,(ulong)local_50[0],0);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (lVar6 != -1) {
          al_draw_tinted_rotated_bitmap
                    (uVar10,fVar12,0x43200000,0x42c80000,0x43200000,0x42c80000,0x3ec90fdb,pAVar1,0);
          return;
        }
        al_draw_rotated_bitmap(0x43200000,0x42c80000,0x43200000,0x42c80000,0x3ec90fdb,pAVar1,0);
        return;
      }
      al_draw_filled_circle(0x43200000,0x42c80000,0x42c80000,uVar10,fVar12);
      return;
    }
    iVar2 = al_get_bitmap_width(pAVar1);
    iVar3 = al_get_bitmap_height(pAVar1);
    iVar4 = std::__cxx11::string::compare((char *)str);
    if (iVar4 != 0) {
      fVar15 = (200.0 / (float)iVar3) * 0.9;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tint","");
      lVar6 = std::__cxx11::string::find((char *)str,(ulong)local_50[0],0);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      fVar17 = (float)iVar2 * fVar15;
      fVar15 = fVar15 * (float)iVar3;
      if (lVar6 != -1) {
        al_draw_tinted_scaled_bitmap(uVar10,fVar12,0,0,pAVar1,0);
        return;
      }
      al_draw_scaled_bitmap
                (0,0,(float)iVar2,(float)iVar3,160.0 - fVar17 * 0.5,100.0 - fVar15 * 0.5,fVar17,
                 fVar15,pAVar1,0);
      return;
    }
    uVar11 = 0x41200000;
    uVar14 = 0x43960000;
    uVar16 = 0x43340000;
    uVar13 = 0x41200000;
  }
  al_draw_filled_rectangle(uVar11,uVar13,uVar14,uVar16,uVar10,fVar12);
  return;
}

Assistant:

void Prog::draw_bitmap(const std::string & str,
   const std::string &how,
   bool memory,
   bool destination)
{
   int i = destination ? 1 : 0;
   int rv = r[i].get_cur_value();
   int gv = g[i].get_cur_value();
   int bv = b[i].get_cur_value();
   int av = a[i].get_cur_value();
   ALLEGRO_COLOR color = makecol(rv, gv, bv, av);
   ALLEGRO_BITMAP *bmp;

   if (contains(str, "Mysha"))
      bmp = (memory ? mysha_bmp : mysha);
   else
      bmp = (memory ? allegro_bmp : allegro);

   if (how == "original") {
      if (str == "Color")
         al_draw_filled_rectangle(0, 0, 320, 200, color);
      else if (contains(str, "tint"))
         al_draw_tinted_bitmap(bmp, color, 0, 0, 0);
      else
         al_draw_bitmap(bmp, 0, 0, 0);
   }
   else if (how == "scaled") {
      int w = al_get_bitmap_width(bmp);
      int h = al_get_bitmap_height(bmp);
      float s = 200.0 / h * 0.9;
      if (str == "Color") {
         al_draw_filled_rectangle(10, 10, 300, 180, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_scaled_bitmap(bmp, color, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
      else {
         al_draw_scaled_bitmap(bmp, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
   }
   else if (how == "rotated") {
      if (str == "Color") {
         al_draw_filled_circle(160, 100, 100, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_rotated_bitmap(bmp, color, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
      else {
         al_draw_rotated_bitmap(bmp, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
   }
}